

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall
gutil::Properties::getStringVector
          (Properties *this,char *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value,char *defvalue,char sep)

{
  ulong uVar1;
  ulong uVar2;
  string s;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  getString(this,key,&local_70,defvalue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(value);
  uVar2 = 0;
  do {
    uVar1 = std::__cxx11::string::find((char)&local_70,(ulong)(uint)(int)sep);
    do {
      if (local_70._M_string_length <= uVar2) {
        std::__cxx11::string::~string((string *)&local_70);
        return;
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar2 = local_70._M_string_length;
    } while (local_70._M_string_length <= uVar1);
    uVar2 = uVar1 + 1;
  } while( true );
}

Assistant:

void Properties::getStringVector(const char *key, std::vector<std::string> &value,
                                 const char *defvalue, const char sep) const
{
  std::string s;
  size_t start, end;

  getString(key, s, defvalue);

  value.clear();

  start=0;
  end=s.find(sep);

  while (start < s.size())
  {
    value.push_back(s.substr(start, end-start));

    start=s.size();

    if (end < s.size())
    {
      start=end+1;
      end=s.find(sep, start);
    }
  }
}